

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void dc_left_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = 0;
  if (0 < bh) {
    uVar4 = (ulong)(uint)bh;
  }
  iVar1 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + (uint)above[uVar2];
  }
  while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
    memset(dst,(int)(iVar1 + ((uint)bh >> 1)) / bh & 0xff,(ulong)(uint)bw);
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void dc_left_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left) {
  int i, r, expected_dc, sum = 0;
  (void)above;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}